

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O1

int aom_film_grain_table_lookup
              (aom_film_grain_table_t *t,int64_t time_stamp,int64_t end_time,int erase,
              aom_film_grain_t *grain)

{
  uint16_t uVar1;
  long lVar2;
  long time_stamp_00;
  bool bVar3;
  aom_film_grain_table_entry_t *paVar4;
  aom_film_grain_table_t *paVar5;
  int unaff_EBP;
  aom_film_grain_table_entry_t *paVar6;
  aom_film_grain_table_entry_t *__src;
  aom_film_grain_table_entry_t *paVar7;
  
  if (grain == (aom_film_grain_t *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = grain->random_seed;
  }
  __src = t->head;
  if (grain != (aom_film_grain_t *)0x0) {
    memset(grain,0,0x288);
  }
  paVar4 = (aom_film_grain_table_entry_t *)0x0;
  do {
    if (__src == (aom_film_grain_table_entry_t *)0x0) {
      return 0;
    }
    paVar7 = __src->next;
    bVar3 = true;
    paVar6 = __src;
    if ((__src->start_time <= time_stamp) && (time_stamp < __src->end_time)) {
      if ((grain != (aom_film_grain_t *)0x0) && (memcpy(grain,__src,0x288), time_stamp != 0)) {
        grain->random_seed = uVar1;
      }
      paVar6 = paVar4;
      paVar7 = __src;
      if (erase == 0) {
        bVar3 = false;
        unaff_EBP = 1;
      }
      else {
        lVar2 = __src->start_time;
        time_stamp_00 = __src->end_time;
        if (end_time < time_stamp_00 || lVar2 < time_stamp) {
          if (time_stamp <= lVar2 && end_time < time_stamp_00) {
            __src->start_time = end_time;
            goto LAB_002a317f;
          }
          if (lVar2 < time_stamp && time_stamp_00 <= end_time) {
            __src->end_time = time_stamp;
            goto LAB_002a317f;
          }
          paVar4 = (aom_film_grain_table_entry_t *)aom_malloc(0x2a0);
          if (paVar4 == (aom_film_grain_table_entry_t *)0x0) {
            unaff_EBP = 0;
          }
          else {
            paVar4->next = __src->next;
            paVar4->start_time = end_time;
            paVar4->end_time = __src->end_time;
            memcpy(paVar4,__src,0x288);
            __src->next = paVar4;
            __src->end_time = time_stamp;
            if (t->tail == __src) {
              t->tail = paVar4;
            }
          }
          if (paVar4 != (aom_film_grain_table_entry_t *)0x0) goto LAB_002a317f;
        }
        else {
          if (t->tail == __src) {
            t->tail = paVar4;
          }
          paVar5 = (aom_film_grain_table_t *)&paVar4->next;
          if (paVar4 == (aom_film_grain_table_entry_t *)0x0) {
            paVar5 = t;
          }
          paVar5->head = __src->next;
          aom_free(__src);
LAB_002a317f:
          unaff_EBP = 1;
          if (time_stamp_00 < end_time) {
            unaff_EBP = 1;
            aom_film_grain_table_lookup(t,time_stamp_00,end_time,1,(aom_film_grain_t *)0x0);
          }
        }
        bVar3 = false;
      }
    }
    paVar4 = paVar6;
    __src = paVar7;
    if (!bVar3) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

int aom_film_grain_table_lookup(aom_film_grain_table_t *t, int64_t time_stamp,
                                int64_t end_time, int erase,
                                aom_film_grain_t *grain) {
  aom_film_grain_table_entry_t *entry = t->head;
  aom_film_grain_table_entry_t *prev_entry = NULL;
  uint16_t random_seed = grain ? grain->random_seed : 0;
  if (grain) memset(grain, 0, sizeof(*grain));

  while (entry) {
    aom_film_grain_table_entry_t *next = entry->next;
    if (time_stamp >= entry->start_time && time_stamp < entry->end_time) {
      if (grain) {
        *grain = entry->params;
        if (time_stamp != 0) grain->random_seed = random_seed;
      }
      if (!erase) return 1;

      const int64_t entry_end_time = entry->end_time;
      if (time_stamp <= entry->start_time && end_time >= entry->end_time) {
        if (t->tail == entry) t->tail = prev_entry;
        if (prev_entry) {
          prev_entry->next = entry->next;
        } else {
          t->head = entry->next;
        }
        aom_free(entry);
      } else if (time_stamp <= entry->start_time &&
                 end_time < entry->end_time) {
        entry->start_time = end_time;
      } else if (time_stamp > entry->start_time &&
                 end_time >= entry->end_time) {
        entry->end_time = time_stamp;
      } else {
        aom_film_grain_table_entry_t *new_entry =
            aom_malloc(sizeof(*new_entry));
        if (!new_entry) return 0;
        new_entry->next = entry->next;
        new_entry->start_time = end_time;
        new_entry->end_time = entry->end_time;
        new_entry->params = entry->params;
        entry->next = new_entry;
        entry->end_time = time_stamp;
        if (t->tail == entry) t->tail = new_entry;
      }
      // If segments aren't aligned, delete from the beginning of subsequent
      // segments
      if (end_time > entry_end_time) {
        // Ignoring the return value here is safe since we're erasing from the
        // beginning of subsequent entries.
        aom_film_grain_table_lookup(t, entry_end_time, end_time, /*erase=*/1,
                                    NULL);
      }
      return 1;
    }
    prev_entry = entry;
    entry = next;
  }
  return 0;
}